

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O0

int CVodeSetConstraints(void *cvode_mem,N_Vector constraints)

{
  N_Vector p_Var1;
  long in_RSI;
  CVodeMem in_RDI;
  double dVar2;
  sunrealtype temptest;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x3c0,"CVodeSetConstraints",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RSI == 0) {
    if (in_RDI->cv_constraintsMallocDone != 0) {
      N_VDestroy(in_RDI->cv_constraints);
      in_RDI->cv_lrw = in_RDI->cv_lrw - in_RDI->cv_lrw1;
      in_RDI->cv_liw = in_RDI->cv_liw - in_RDI->cv_liw1;
    }
    in_RDI->cv_constraintsMallocDone = 0;
    in_RDI->cv_constraintsSet = 0;
    local_4 = 0;
  }
  else if ((((*(long *)(*(long *)(in_RSI + 8) + 0x70) == 0) ||
            (*(long *)(*(long *)(in_RSI + 8) + 0xa0) == 0)) ||
           (*(long *)(*(long *)(in_RSI + 8) + 0xd0) == 0)) ||
          ((*(long *)(*(long *)(in_RSI + 8) + 0xe0) == 0 ||
           (*(long *)(*(long *)(in_RSI + 8) + 0xe8) == 0)))) {
    cvProcessError(in_RDI,-0x16,0x3db,"CVodeSetConstraints",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                   ,"A required vector operation is not implemented.");
    local_4 = -0x16;
  }
  else {
    dVar2 = (double)N_VMaxNorm(in_RSI);
    if ((2.5 < dVar2) || (dVar2 < 0.5)) {
      cvProcessError(in_RDI,-0x16,0x3e4,"CVodeSetConstraints",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                     ,"Illegal values in constraints vector.");
      local_4 = -0x16;
    }
    else {
      if (in_RDI->cv_constraintsMallocDone == 0) {
        p_Var1 = (N_Vector)N_VClone(in_RSI);
        in_RDI->cv_constraints = p_Var1;
        in_RDI->cv_lrw = in_RDI->cv_lrw1 + in_RDI->cv_lrw;
        in_RDI->cv_liw = in_RDI->cv_liw1 + in_RDI->cv_liw;
        in_RDI->cv_constraintsMallocDone = 1;
      }
      N_VScale(0x3ff0000000000000,in_RSI,in_RDI->cv_constraints);
      in_RDI->cv_constraintsSet = 1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int CVodeSetConstraints(void* cvode_mem, N_Vector constraints)
{
  CVodeMem cv_mem;
  sunrealtype temptest;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  /* If there are no constraints, destroy data structures */
  if (constraints == NULL)
  {
    if (cv_mem->cv_constraintsMallocDone)
    {
      N_VDestroy(cv_mem->cv_constraints);
      cv_mem->cv_lrw -= cv_mem->cv_lrw1;
      cv_mem->cv_liw -= cv_mem->cv_liw1;
    }
    cv_mem->cv_constraintsMallocDone = SUNFALSE;
    cv_mem->cv_constraintsSet        = SUNFALSE;
    return (CV_SUCCESS);
  }

  /* Test if required vector ops. are defined */

  if (constraints->ops->nvdiv == NULL || constraints->ops->nvmaxnorm == NULL ||
      constraints->ops->nvcompare == NULL ||
      constraints->ops->nvconstrmask == NULL ||
      constraints->ops->nvminquotient == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_NVECTOR);
    return (CV_ILL_INPUT);
  }

  /* Check the constraints vector */
  temptest = N_VMaxNorm(constraints);
  if ((temptest > TWOPT5) || (temptest < HALF))
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_CONSTR);
    return (CV_ILL_INPUT);
  }

  if (!(cv_mem->cv_constraintsMallocDone))
  {
    cv_mem->cv_constraints = N_VClone(constraints);
    cv_mem->cv_lrw += cv_mem->cv_lrw1;
    cv_mem->cv_liw += cv_mem->cv_liw1;
    cv_mem->cv_constraintsMallocDone = SUNTRUE;
  }

  /* Load the constraints vector */
  N_VScale(ONE, constraints, cv_mem->cv_constraints);

  cv_mem->cv_constraintsSet = SUNTRUE;

  return (CV_SUCCESS);
}